

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syncprod.cc
# Opt level: O0

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
tchecker::syncprod::committed_processes
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          system_t *system,const_vloc_sptr_t *vloc)

{
  bool bVar1;
  process_id_t pVar2;
  size_t num_bits;
  element_type *this;
  reference rVar3;
  undefined1 local_78 [16];
  reference local_68;
  loc_id_t local_54;
  pointer pvStack_50;
  loc_id_t id;
  const_iterator_t __end2;
  const_iterator_t __begin2;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *__range2;
  allocator<unsigned_long> local_22;
  undefined1 local_21;
  pointer local_20;
  const_vloc_sptr_t *vloc_local;
  system_t *system_local;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *committed;
  
  local_21 = 0;
  local_20 = (pointer)vloc;
  vloc_local = (const_vloc_sptr_t *)system;
  system_local = (system_t *)__return_storage_ptr__;
  num_bits = tchecker::system::processes_t::processes_count
                       (&(system->super_system_t).super_processes_t);
  std::allocator<unsigned_long>::allocator(&local_22);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (__return_storage_ptr__,num_bits,0,&local_22);
  std::allocator<unsigned_long>::~allocator(&local_22);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
            (__return_storage_ptr__);
  __begin2 = (const_iterator_t)
             intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
             ::operator*((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
                          *)local_20);
  __end2 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::begin
                     ((make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)__begin2);
  pvStack_50 = (pointer)make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::end
                                  ((make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
                                   __begin2);
  for (; (pointer)__end2 != pvStack_50; __end2 = __end2 + 1) {
    local_54 = *__end2;
    bVar1 = system_t::is_committed((system_t *)vloc_local,local_54);
    if (bVar1) {
      tchecker::system::locs_t::location((locs_t *)local_78,(int)vloc_local + 0x230);
      this = std::
             __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_78);
      pVar2 = tchecker::system::loc_t::pid(this);
      rVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (__return_storage_ptr__,(ulong)pVar2);
      local_68 = rVar3;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reference::operator=
                (&local_68,true);
      std::shared_ptr<const_tchecker::system::loc_t>::~shared_ptr
                ((shared_ptr<const_tchecker::system::loc_t> *)local_78);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

boost::dynamic_bitset<> committed_processes(tchecker::syncprod::system_t const & system,
                                            tchecker::const_vloc_sptr_t const & vloc)
{
  boost::dynamic_bitset<> committed(system.processes_count());
  committed.reset();
  for (tchecker::loc_id_t id : *vloc)
    if (system.is_committed(id))
      committed[system.location(id)->pid()] = 1;
  return committed;
}